

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O0

void NativeCodeData::AddFixupEntry
               (void *targetAddr,void *targetStartAddr,void *addrToFixup,void *startAddress,
               DataChunk *chunkList)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  DataChunk *pDVar5;
  DataChunk *pDVar6;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar7;
  NativeDataFixupEntry *entry;
  DataChunk *chunk;
  bool foundTargetChunk;
  DataChunk *targetChunk;
  DataChunk *pDStack_30;
  uint inDataOffset;
  DataChunk *chunkList_local;
  void *startAddress_local;
  void *addrToFixup_local;
  void *targetStartAddr_local;
  void *targetAddr_local;
  
  if (addrToFixup < startAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2a,"(addrToFixup >= startAddress)","addrToFixup >= startAddress");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((ulong)addrToFixup & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2b,"(((long)addrToFixup) % sizeof(void*) == 0)",
                       "((__int64)addrToFixup) % sizeof(void*) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (targetAddr != (void *)0x0) {
    if (targetStartAddr == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x32,"(targetStartAddr)","targetStartAddr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    uVar3 = (int)targetAddr - (int)targetStartAddr;
    pDVar5 = GetDataChunk(targetStartAddr);
    if (pDVar5->len < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x36,"(targetChunk->len >= inDataOffset)",
                         "targetChunk->len >= inDataOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((DAT_01e9e22a & 1) != 0) {
      bVar2 = false;
      for (pDStack_30 = chunkList; pDStack_30 != (DataChunk *)0x0; pDStack_30 = pDStack_30->next) {
        bVar2 = bVar2 || pDStack_30 == pDVar5;
      }
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                           ,0x41,"(foundTargetChunk)",
                           "current pointer is not allocated with NativeCodeData allocator?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    pDVar6 = GetDataChunk(startAddress);
    hHeap = GetProcessHeap();
    pNVar7 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
    if (pNVar7 == (NativeDataFixupEntry *)0x0) {
      Js::Throw::OutOfMemory();
    }
    pNVar7->addrOffset = (int)addrToFixup - (int)startAddress;
    if ((ulong)pDVar6->len - 8 < (ulong)pNVar7->addrOffset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x4e,"(entry->addrOffset <= chunk->len - sizeof(void*))",
                         "entry->addrOffset <= chunk->len - sizeof(void*)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pNVar7->targetTotalOffset = pDVar5->offset + uVar3;
    pNVar7->next = pDVar6->fixupList;
    pDVar6->fixupList = pNVar7;
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
    if (bVar2) {
      Output::Print(L"NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                    addrToFixup,startAddress,(ulong)pNVar7->addrOffset,pDVar6,targetAddr,pDVar5,
                    pDVar6->dataType);
    }
  }
  return;
}

Assistant:

void
NativeCodeData::AddFixupEntry(void* targetAddr, void* targetStartAddr, void* addrToFixup, void* startAddress, DataChunk * chunkList)
{
    Assert(addrToFixup >= startAddress);
    Assert(((__int64)addrToFixup) % sizeof(void*) == 0);

    if (targetAddr == nullptr)
    {
        return;
    }

    Assert(targetStartAddr);

    unsigned int inDataOffset = (unsigned int)((char*)targetAddr - (char*)targetStartAddr);
    DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetStartAddr);
    Assert(targetChunk->len >= inDataOffset);

#if DBG
    if (CONFIG_FLAG(OOPJITFixupValidate))
    {
        bool foundTargetChunk = false;
        while (chunkList)
        {
            foundTargetChunk |= (chunkList == targetChunk);
            chunkList = chunkList->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
    }
#endif

    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);

    NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
    if (!entry)
    {
        Js::Throw::OutOfMemory();
    }
    __analysis_assume(entry);
    entry->addrOffset = (unsigned int)((__int64)addrToFixup - (__int64)startAddress);
    Assert(entry->addrOffset <= chunk->len - sizeof(void*));

    entry->targetTotalOffset = targetChunk->offset + inDataOffset;
    entry->next = chunk->fixupList;
    chunk->fixupList = entry;

#if DBG
    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
    {
        Output::Print(_u("NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
            addrToFixup, startAddress, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
    }
#endif
}